

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1122e::TestCanSetandGetDetails::TestCanSetandGetDetails
          (TestCanSetandGetDetails *this)

{
  char *suiteName;
  TestCanSetandGetDetails *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CanSetandGetDetails",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCurrentTest.cpp"
             ,8);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestCanSetandGetDetails_00183ee8;
  return;
}

Assistant:

TEST(CanSetandGetDetails)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		const UnitTest::TestDetails* details = reinterpret_cast< const UnitTest::TestDetails* >(12345);
		UnitTest::CurrentTest::Details() = details;

		ok = (UnitTest::CurrentTest::Details() == details);
	}

	CHECK(ok);
}